

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

int container_rank(container_t *c,uint8_t type,uint16_t x)

{
  int iVar1;
  array_container_t *arr;
  uint8_t local_11;
  
  local_11 = type;
  arr = (array_container_t *)container_unwrap_shared(c,&local_11);
  if (local_11 == '\x03') {
    iVar1 = run_container_rank((run_container_t *)arr,x);
    return iVar1;
  }
  if (local_11 != '\x02') {
    if (local_11 == '\x01') {
      iVar1 = bitset_container_rank((bitset_container_t *)arr,x);
      return iVar1;
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x18ee,"int container_rank(const container_t *, uint8_t, uint16_t)");
  }
  iVar1 = array_container_rank(arr,x);
  return iVar1;
}

Assistant:

static inline int container_rank(
    const container_t *c, uint8_t type,
    uint16_t x
){
    c = container_unwrap_shared(c, &type);
    switch (type) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_rank(const_CAST_bitset(c), x);
        case ARRAY_CONTAINER_TYPE:
            return array_container_rank(const_CAST_array(c), x);
        case RUN_CONTAINER_TYPE:
            return run_container_rank(const_CAST_run(c), x);
        default:
            assert(false);
            __builtin_unreachable();
    }
    assert(false);
    __builtin_unreachable();
    return false;
}